

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::SerializeWithCachedSizes
          (WordTagger *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  if (this->revision_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->revision_,output);
  }
  psVar1 = (this->language_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.language");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (10,(this->language_).ptr_,output);
  }
  psVar1 = (this->tokensoutputfeaturename_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x14,(this->tokensoutputfeaturename_).ptr_,output);
  }
  psVar1 = (this->tokentagsoutputfeaturename_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x15,(this->tokentagsoutputfeaturename_).ptr_,output);
  }
  psVar1 = (this->tokenlocationsoutputfeaturename_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x16,(this->tokenlocationsoutputfeaturename_).ptr_,output);
  }
  psVar1 = (this->tokenlengthsoutputfeaturename_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x17,(this->tokenlengthsoutputfeaturename_).ptr_,output);
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar1,output);
  }
  if (this->_oneof_case_[0] == 200) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->Tags_).stringtags_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void WordTagger::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.WordTagger)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // string tokensOutputFeatureName = 20;
  if (this->tokensoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->tokensoutputfeaturename(), output);
  }

  // string tokenTagsOutputFeatureName = 21;
  if (this->tokentagsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->tokentagsoutputfeaturename(), output);
  }

  // string tokenLocationsOutputFeatureName = 22;
  if (this->tokenlocationsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      22, this->tokenlocationsoutputfeaturename(), output);
  }

  // string tokenLengthsOutputFeatureName = 23;
  if (this->tokenlengthsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      23, this->tokenlengthsoutputfeaturename(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // .CoreML.Specification.StringVector stringTags = 200;
  if (has_stringtags()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *Tags_.stringtags_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.WordTagger)
}